

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O2

void __thiscall bdNodeManager::~bdNodeManager(bdNodeManager *this)

{
  (this->super_bdNode).super_bdNodePublisher._vptr_bdNodePublisher =
       (_func_int **)&PTR_send_ping_001565f0;
  (this->super_BitDhtInterface)._vptr_BitDhtInterface = (_func_int **)&PTR_addBadPeer_001566e8;
  stopDht(this);
  bloomFilter::~bloomFilter(&(this->mBloomFilter).super_bloomFilter);
  std::__cxx11::_List_base<BitDhtCallback_*,_std::allocator<BitDhtCallback_*>_>::_M_clear
            (&(this->mCallbacks).
              super__List_base<BitDhtCallback_*,_std::allocator<BitDhtCallback_*>_>);
  std::
  _Rb_tree<bdNodeId,_std::pair<const_bdNodeId,_bdQueryPeer>,_std::_Select1st<std::pair<const_bdNodeId,_bdQueryPeer>_>,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryPeer>_>_>
  ::~_Rb_tree(&(this->mActivePeers)._M_t);
  bdNode::~bdNode(&this->super_bdNode);
  return;
}

Assistant:

bdNodeManager::~bdNodeManager() {
    stopDht();
}